

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O3

RealType * __thiscall OpenMD::DataStorage::getArrayPointer(DataStorage *this,int whichArray)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  
  if (whichArray < 0x200) {
    if (whichArray < 0x20) {
      pSVar1 = (pointer)0x0;
      switch(whichArray) {
      case 1:
        pSVar2 = (pointer)(this->position).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->position).
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
        break;
      case 2:
        pSVar2 = (pointer)(this->velocity).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->velocity).
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        goto switchD_001f36b1_caseD_3;
      case 4:
        pSVar2 = (pointer)(this->force).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->force).
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
        break;
      case 8:
        pSVar2 = (this->aMat).
                 super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (this->aMat).
                          super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        break;
      default:
        if (whichArray != 0x10) {
          return (RealType *)(pointer)0x0;
        }
        pSVar2 = (pointer)(this->angularMomentum).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->angularMomentum).
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (whichArray < 0x80) {
      if (whichArray == 0x20) {
        pSVar2 = (pointer)(this->torque).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->torque).
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (whichArray != 0x40) {
          return (RealType *)0x0;
        }
        pSVar2 = (pointer)(this->particlePot).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->particlePot).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
      }
    }
    else if (whichArray == 0x80) {
      pSVar2 = (pointer)(this->density).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
      bVar3 = pSVar2 == (pointer)(this->density).super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (whichArray != 0x100) {
        return (RealType *)0x0;
      }
      pSVar2 = (pointer)(this->functional).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      bVar3 = pSVar2 == (pointer)(this->functional).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
    }
  }
  else if (whichArray < 0x2000) {
    if (whichArray < 0x800) {
      if (whichArray == 0x200) {
        pSVar2 = (pointer)(this->functionalDerivative).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->functionalDerivative).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
      }
      else {
        if (whichArray != 0x400) {
          return (RealType *)0x0;
        }
        pSVar2 = (pointer)(this->dipole).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = pSVar2 == (pointer)(this->dipole).
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (whichArray == 0x800) {
      pSVar2 = (this->quadrupole).
               super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = pSVar2 == (this->quadrupole).
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (whichArray != 0x1000) {
        return (RealType *)0x0;
      }
      pSVar2 = (pointer)(this->electricField).
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = pSVar2 == (pointer)(this->electricField).
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else if (whichArray < 0x8000) {
    if (whichArray == 0x2000) {
      pSVar2 = (pointer)(this->skippedCharge).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      bVar3 = pSVar2 == (pointer)(this->skippedCharge).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
    }
    else {
      if (whichArray != 0x4000) {
        return (RealType *)0x0;
      }
      pSVar2 = (pointer)(this->flucQPos).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start;
      bVar3 = pSVar2 == (pointer)(this->flucQPos).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
    }
  }
  else if (whichArray == 0x8000) {
    pSVar2 = (pointer)(this->flucQVel).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
    bVar3 = pSVar2 == (pointer)(this->flucQVel).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
  }
  else if (whichArray == 0x10000) {
    pSVar2 = (pointer)(this->flucQFrc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
    bVar3 = pSVar2 == (pointer)(this->flucQFrc).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (whichArray != 0x20000) {
      return (RealType *)0x0;
    }
    pSVar2 = (pointer)(this->sitePotential).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    bVar3 = pSVar2 == (pointer)(this->sitePotential).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish;
  }
  pSVar1 = (pointer)0x0;
  if (!bVar3) {
    pSVar1 = pSVar2;
  }
switchD_001f36b1_caseD_3:
  return (RealType *)pSVar1;
}

Assistant:

RealType* DataStorage::getArrayPointer(int whichArray) {
    switch (whichArray) {
    case dslPosition:
      return internalGetArrayPointer(position);

    case dslVelocity:
      return internalGetArrayPointer(velocity);

    case dslForce:
      return internalGetArrayPointer(force);

    case dslAmat:
      return internalGetArrayPointer(aMat);

    case dslAngularMomentum:
      return internalGetArrayPointer(angularMomentum);

    case dslTorque:
      return internalGetArrayPointer(torque);

    case dslParticlePot:
      return internalGetArrayPointer(particlePot);

    case dslDensity:
      return internalGetArrayPointer(density);

    case dslFunctional:
      return internalGetArrayPointer(functional);

    case dslFunctionalDerivative:
      return internalGetArrayPointer(functionalDerivative);

    case dslDipole:
      return internalGetArrayPointer(dipole);

    case dslQuadrupole:
      return internalGetArrayPointer(quadrupole);

    case dslElectricField:
      return internalGetArrayPointer(electricField);

    case dslSkippedCharge:
      return internalGetArrayPointer(skippedCharge);

    case dslFlucQPosition:
      return internalGetArrayPointer(flucQPos);

    case dslFlucQVelocity:
      return internalGetArrayPointer(flucQVel);

    case dslFlucQForce:
      return internalGetArrayPointer(flucQFrc);

    case dslSitePotential:
      return internalGetArrayPointer(sitePotential);

    default:
      // error message
      return NULL;
    }
  }